

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O2

UINT8 device_start_saa1099_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA info;
  UINT8 UVar2;
  uint uVar3;
  
  uVar1 = cfg->clock;
  uVar3 = uVar1 >> 7;
  if (cfg->srMode == '\x02') {
    if (uVar3 <= cfg->smplRate) {
      uVar3 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar3 = cfg->smplRate;
  }
  info.chipInf = calloc(1,0x150);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(uint *)&((DEV_DATA *)((long)info.chipInf + 0x148))->chipInf = uVar1;
    ((DEV_DATA *)((long)info.chipInf + 0x140))->chipInf = (void *)(double)uVar3;
    UVar2 = '\0';
    saa1099m_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = uVar3;
    retDevInf->devDef = &devDef_SAA1099_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_saa1099_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;	// /128 seems right based on the highest noise frequency
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099m_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_MAME);
	return 0x00;
}